

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

void nni_http_conn_fini(nni_http_conn *conn)

{
  nni_mtx *mtx;
  
  nni_aio_stop(&conn->wr_aio);
  nni_aio_stop(&conn->rd_aio);
  mtx = &conn->mtx;
  nni_mtx_lock(mtx);
  http_close(conn);
  if (conn->sock != (nng_stream *)0x0) {
    nng_stream_free(conn->sock);
    conn->sock = (nng_stream *)0x0;
  }
  nni_mtx_unlock(mtx);
  nni_aio_fini(&conn->wr_aio);
  nni_aio_fini(&conn->rd_aio);
  nni_http_conn_reset(conn);
  nni_free(conn->buf,conn->bufsz);
  nni_mtx_fini(mtx);
  nni_free(conn,0x8e8);
  return;
}

Assistant:

void
nni_http_conn_fini(nni_http_conn *conn)
{
	nni_aio_stop(&conn->wr_aio);
	nni_aio_stop(&conn->rd_aio);

	nni_mtx_lock(&conn->mtx);
	http_close(conn);
	if (conn->sock != NULL) {
		nng_stream_free(conn->sock);
		conn->sock = NULL;
	}
	nni_mtx_unlock(&conn->mtx);

	nni_aio_fini(&conn->wr_aio);
	nni_aio_fini(&conn->rd_aio);
	nni_http_conn_reset(conn);
	nni_free(conn->buf, conn->bufsz);
	nni_mtx_fini(&conn->mtx);
	NNI_FREE_STRUCT(conn);
}